

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O0

Gia_Man_t * Bmc_CexPerformUnrolling(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  bool bVar7;
  int local_48;
  int local_44;
  int k;
  int i;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                  ,0x8f,"Gia_Man_t *Bmc_CexPerformUnrolling(Gia_Man_t *, Abc_Cex_t *)");
  }
  iVar1 = pCex->iFrame;
  iVar2 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart((iVar1 + 1) * iVar2);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  local_48 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar7 = false;
    if (local_48 < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      pObjRo = Gia_ManCo(p,iVar1 + local_48);
      bVar7 = pObjRo != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    pObjRo->Value = 0;
    local_48 = local_48 + 1;
  }
  Gia_ManHashAlloc(p_00);
  for (local_44 = 0; local_44 <= pCex->iFrame; local_44 = local_44 + 1) {
    local_48 = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(p);
      bVar7 = false;
      if (local_48 < iVar1) {
        pObjRo = Gia_ManCi(p,local_48);
        bVar7 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      uVar3 = Gia_ManAppendCi(p_00);
      pObjRo->Value = uVar3;
      local_48 = local_48 + 1;
    }
    local_48 = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar7 = false;
      if (local_48 < iVar1) {
        iVar1 = Gia_ManPoNum(p);
        _k = Gia_ManCo(p,iVar1 + local_48);
        bVar7 = false;
        if (_k != (Gia_Obj_t *)0x0) {
          iVar1 = Gia_ManPiNum(p);
          pObjRi = Gia_ManCi(p,iVar1 + local_48);
          bVar7 = pObjRi != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar7) break;
      pObjRi->Value = _k->Value;
      local_48 = local_48 + 1;
    }
    local_48 = 0;
    while( true ) {
      bVar7 = false;
      if (local_48 < p->nObjs) {
        pObjRo = Gia_ManObj(p,local_48);
        bVar7 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjIsAnd(pObjRo);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFanin0Copy(pObjRo);
        iVar2 = Gia_ObjFanin1Copy(pObjRo);
        uVar3 = Gia_ManHashAnd(p_00,iVar1,iVar2);
        pObjRo->Value = uVar3;
      }
      local_48 = local_48 + 1;
    }
    local_48 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar7 = false;
      if (local_48 < iVar1) {
        pObjRo = Gia_ManCo(p,local_48);
        bVar7 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      uVar3 = Gia_ObjFanin0Copy(pObjRo);
      pObjRo->Value = uVar3;
      local_48 = local_48 + 1;
    }
  }
  Gia_ManHashStop(p_00);
  pGVar5 = Gia_ManPo(p,pCex->iPo);
  Gia_ManAppendCo(p_00,pGVar5->Value);
  pGVar6 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Bmc_CexPerformUnrolling( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int i, k;
    assert( Gia_ManRegNum(p) > 0 );
    pNew = Gia_ManStart( (pCex->iFrame + 1) * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachRi( p, pObj, k )
        pObj->Value = 0;
    Gia_ManHashAlloc( pNew );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->Value = pObjRi->Value;
        Gia_ManForEachAnd( p, pObj, k )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( p, pObj, k )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
    }
    Gia_ManHashStop( pNew );
    pObj = Gia_ManPo(p, pCex->iPo);
    Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}